

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

string * __thiscall
fmt::v5::format<unsigned_long,unsigned_long,char,int>
          (string *__return_storage_ptr__,v5 *this,string_view format_str,unsigned_long *args,
          unsigned_long *args_1,char *args_2,int *args_3)

{
  string_view format_str_00;
  format_args args_00;
  undefined8 local_48 [2];
  unsigned_long local_38;
  ulong local_28;
  ulong local_18;
  
  format_str_00.data_ = format_str.data_;
  local_48[0] = *(undefined8 *)format_str.size_;
  local_38 = *args;
  local_28 = (ulong)(uint)(int)(char)*args_1;
  local_18 = (ulong)*(uint *)args_2;
  format_str_00.size_ = 0x2755;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)args_1;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .types_ = (unsigned_long_long)local_48;
  vformat_abi_cxx11_(__return_storage_ptr__,this,format_str_00,args_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format(string_view format_str, const Args & ... args) {
  // This should be just
  // return vformat(format_str, make_format_args(args...));
  // but gcc has trouble optimizing the latter, so break it down.
  format_arg_store<format_context, Args...> as{args...};
  return vformat(format_str, as);
}